

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPipeConnection.cxx
# Opt level: O2

bool __thiscall cmPipeConnection::OnServeStart(cmPipeConnection *this,string *errorMessage)

{
  auto_pipe_t *this_00;
  bool bVar1;
  int iVar2;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  char *pcVar3;
  uv_stream_t *stream;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &this->ServerPipe;
  ctx = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
  auto_pipe_t::init(this_00,(EVP_PKEY_CTX *)ctx);
  handle = auto_handle_::operator_cast_to_uv_pipe_s_(&this_00->super_auto_handle_<uv_pipe_s>);
  iVar2 = uv_pipe_bind(handle,(this->PipeName)._M_dataplus._M_p);
  if (iVar2 == 0) {
    stream = auto_pipe_t::operator_cast_to_uv_stream_s_(this_00);
    iVar2 = uv_listen(stream,1,cmEventBasedConnection::on_new_connection);
    if (iVar2 == 0) {
      bVar1 = cmConnection::OnServeStart((cmConnection *)this,errorMessage);
      return bVar1;
    }
    std::__cxx11::string::string((string *)&local_a8,"Internal Error listening on ",&local_a9);
    std::operator+(&local_88,&local_a8,&this->PipeName);
    std::operator+(&local_68,&local_88,": ");
    pcVar3 = uv_err_name(iVar2);
    std::operator+(&local_48,&local_68,pcVar3);
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,"Internal Error with ",&local_a9);
    std::operator+(&local_88,&local_a8,&this->PipeName);
    std::operator+(&local_68,&local_88,": ");
    pcVar3 = uv_err_name(iVar2);
    std::operator+(&local_48,&local_68,pcVar3);
  }
  std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  return false;
}

Assistant:

bool cmPipeConnection::OnServeStart(std::string* errorMessage)
{
  this->ServerPipe.init(*this->Server->GetLoop(), 0,
                        static_cast<cmEventBasedConnection*>(this));

  int r;
  if ((r = uv_pipe_bind(this->ServerPipe, this->PipeName.c_str())) != 0) {
    *errorMessage = std::string("Internal Error with ") + this->PipeName +
      ": " + uv_err_name(r);
    return false;
  }

  if ((r = uv_listen(this->ServerPipe, 1, on_new_connection)) != 0) {
    *errorMessage = std::string("Internal Error listening on ") +
      this->PipeName + ": " + uv_err_name(r);
    return false;
  }

  return cmConnection::OnServeStart(errorMessage);
}